

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O2

int __thiscall cmProcess::GetNextOutputLine(cmProcess *this,string *line,double timeout)

{
  Buffer *this_00;
  bool bVar1;
  int iVar2;
  double dVar3;
  cmProcessOutput processOutput;
  int length;
  double timeout_local;
  string strdata;
  char *data;
  string local_50;
  
  timeout_local = timeout;
  cmProcessOutput::cmProcessOutput(&processOutput,UTF8,0x400);
  strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
  strdata._M_string_length = 0;
  strdata.field_2._M_local_buf[0] = '\0';
  this_00 = &this->Output;
  do {
    bVar1 = Buffer::GetLine(this_00,line);
    if (bVar1) {
      iVar2 = 2;
LAB_0034c53b:
      std::__cxx11::string::~string((string *)&strdata);
      cmProcessOutput::~cmProcessOutput(&processOutput);
      return iVar2;
    }
    iVar2 = cmsysProcess_WaitForData(this->Process,&data,&length,&timeout_local);
    if (iVar2 != 2) {
      if (iVar2 != 0xff) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        cmProcessOutput::DecodeText(&processOutput,&local_50,&strdata,0);
        std::__cxx11::string::~string((string *)&local_50);
        iVar2 = 2;
        if (strdata._M_string_length != 0) {
          std::vector<char,std::allocator<char>>::
          insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                    ((vector<char,std::allocator<char>> *)this_00,
                     (const_iterator)
                     (this->Output).super_vector<char,_std::allocator<char>_>.
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_finish,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )strdata._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(strdata._M_dataplus._M_p + strdata._M_string_length));
        }
        bVar1 = Buffer::GetLast(this_00,line);
        if (bVar1) goto LAB_0034c53b;
        iVar2 = cmsysProcess_WaitForExit(this->Process,&timeout_local);
        if (iVar2 != 0) {
          iVar2 = cmsysProcess_GetExitValue(this->Process);
          this->ExitValue = iVar2;
          dVar3 = cmsys::SystemTools::GetTime();
          dVar3 = dVar3 - this->StartTime;
          this->TotalTime = (double)(~-(ulong)(dVar3 <= 0.0) & (ulong)dVar3);
          iVar2 = 0;
          goto LAB_0034c53b;
        }
      }
      iVar2 = 0xff;
      goto LAB_0034c53b;
    }
    cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,0);
    std::vector<char,std::allocator<char>>::
    insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((vector<char,std::allocator<char>> *)this_00,
               (const_iterator)
               (this->Output).super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_finish,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )strdata._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(strdata._M_dataplus._M_p + strdata._M_string_length));
  } while( true );
}

Assistant:

int cmProcess::GetNextOutputLine(std::string& line, double timeout)
{
  cmProcessOutput processOutput(cmProcessOutput::UTF8);
  std::string strdata;
  for (;;) {
    // Look for lines already buffered.
    if (this->Output.GetLine(line)) {
      return cmsysProcess_Pipe_STDOUT;
    }

    // Check for more data from the process.
    char* data;
    int length;
    int p = cmsysProcess_WaitForData(this->Process, &data, &length, &timeout);
    if (p == cmsysProcess_Pipe_Timeout) {
      return cmsysProcess_Pipe_Timeout;
    }
    if (p == cmsysProcess_Pipe_STDOUT) {
      processOutput.DecodeText(data, length, strdata);
      this->Output.insert(this->Output.end(), strdata.begin(), strdata.end());
    } else { // p == cmsysProcess_Pipe_None
      // The process will provide no more data.
      break;
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    this->Output.insert(this->Output.end(), strdata.begin(), strdata.end());
  }

  // Look for partial last lines.
  if (this->Output.GetLast(line)) {
    return cmsysProcess_Pipe_STDOUT;
  }

  // No more data.  Wait for process exit.
  if (!cmsysProcess_WaitForExit(this->Process, &timeout)) {
    return cmsysProcess_Pipe_Timeout;
  }

  // Record exit information.
  this->ExitValue = cmsysProcess_GetExitValue(this->Process);
  this->TotalTime = cmSystemTools::GetTime() - this->StartTime;
  // Because of a processor clock scew the runtime may become slightly
  // negative. If someone changed the system clock while the process was
  // running this may be even more. Make sure not to report a negative
  // duration here.
  if (this->TotalTime <= 0.0) {
    this->TotalTime = 0.0;
  }
  //  std::cerr << "Time to run: " << this->TotalTime << "\n";
  return cmsysProcess_Pipe_None;
}